

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O3

void __thiscall cppforth::Forth::setdashorder(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  SCell SVar1;
  pointer piVar2;
  SCell *pSVar3;
  uint uVar4;
  uint uVar5;
  uint local_2c;
  
  requireDStackDepth(this,1,"SET-ORDER");
  this_00 = &this->dStack;
  uVar4 = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  if (uVar4 == 0xffffffff) {
    std::vector<int,_std::allocator<int>_>::resize(&this->searchOrder,2);
    SVar1 = this->widForthWordList;
    pSVar3 = (this->searchOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    *pSVar3 = SVar1;
    pSVar3[1] = SVar1;
  }
  else {
    requireDStackDepth(this,(long)(int)uVar4,"SET-ORDER");
    piVar2 = (this->searchOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->searchOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish != piVar2) {
      (this->searchOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = piVar2;
    }
    if (0 < (int)uVar4) {
      uVar4 = uVar4 + 1;
      do {
        uVar5 = ForthStack<unsigned_int>::getTop(this_00);
        ForthStack<unsigned_int>::pop(this_00);
        local_2c = uVar5;
        std::vector<int,_std::allocator<int>_>::_M_insert_rval
                  (&this->searchOrder,
                   (const_iterator)
                   (this->searchOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start,(value_type_conflict4 *)&local_2c);
        uVar4 = uVar4 - 1;
      } while (1 < uVar4);
    }
  }
  return;
}

Assistant:

void setdashorder(){
			REQUIRE_DSTACK_DEPTH(1, "SET-ORDER");
			SCell n=dStack.getTop();pop();
			if(n==-1){
				only(); // -1 SET-ORDER and ONLY must have the same behaviour
			} else {
			REQUIRE_DSTACK_DEPTH(n, "SET-ORDER");
			searchOrder.clear();
			while(n>0){
				--n;
				Cell wid=dStack.getTop();pop();
				searchOrder.insert(searchOrder.begin(),wid);
			}
			}
		}